

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_bag<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  bool bVar1;
  reference ppeVar2;
  polyprediction *this;
  size_type sVar3;
  action_score **ppaVar4;
  reference pvVar5;
  size_t sVar6;
  action_score *paVar7;
  action_scores *a_s;
  action_scores *paVar8;
  action_score *paVar9;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  v_array<ACTION_SCORE::action_score> *in_RDI;
  size_t i_4;
  uint32_t i_3;
  size_t i_2;
  size_t tied_actions;
  action_score e;
  action_score *__end3;
  action_score *__begin3;
  v_array<ACTION_SCORE::action_score> *__range3;
  uint32_t count;
  uint32_t i_1;
  bool test_sequence;
  vector<float,_std::allocator<float>_> *top_actions;
  uint32_t i;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  cb_explore_adf *in_stack_00000160;
  multi_ex *in_stack_00000600;
  action_score *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff00;
  example *in_stack_ffffffffffffff08;
  float local_e8;
  score_iterator *in_stack_ffffffffffffff20;
  ulong i_00;
  score_iterator *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff33;
  float in_stack_ffffffffffffff34;
  score_iterator *in_stack_ffffffffffffff38;
  score_iterator *in_stack_ffffffffffffff40;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_ffffffffffffff48;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff5c;
  uint64_t in_stack_ffffffffffffff60;
  multi_ex *in_stack_ffffffffffffff68;
  multi_learner *in_stack_ffffffffffffff70;
  uint local_7c;
  ulong local_78;
  float fStack_64;
  action_score *local_58;
  uint local_44;
  uint local_28;
  uint local_24;
  
  ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  this = &(*ppeVar2)->pred;
  sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  local_24 = (uint)sVar3;
  std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  bVar1 = CB::ec_is_example_header(in_stack_ffffffffffffff08);
  if (bVar1) {
    local_24 = local_24 - 1;
  }
  if (local_24 == 0) {
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  else {
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x301a52);
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (value_type_conflict3 *)in_stack_fffffffffffffee8);
    }
    std::vector<float,_std::allocator<float>_>::assign
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (size_type)in_stack_fffffffffffffee8,(value_type_conflict3 *)0x301ae3);
    test_adf_sequence(in_stack_00000600);
    for (local_44 = 0; (action_score *)(ulong)local_44 < in_RDI[3]._end; local_44 = local_44 + 1) {
      LEARNER::multiline_learn_or_predict<false>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c);
      ppaVar4 = v_array<ACTION_SCORE::action_score>::begin
                          ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
      local_58 = *ppaVar4;
      ppaVar4 = v_array<ACTION_SCORE::action_score>::end
                          ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
      paVar7 = *ppaVar4;
      for (; local_58 != paVar7; local_58 = local_58 + 1) {
        fStack_64 = (*local_58).score;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 1),
                            (ulong)*local_58 & 0xffffffff);
        *pvVar5 = fStack_64 + *pvVar5;
      }
      if (((ulong)in_RDI[4].end_array & 0x100) == 0) {
        sVar6 = fill_tied((cb_explore_adf *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        for (local_78 = 0; local_78 < sVar6; local_78 = local_78 + 1) {
          local_e8 = (float)sVar6;
          in_stack_ffffffffffffff08 = (example *)&in_RDI[1].erase_count;
          paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                             ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_78);
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff08,
                              (ulong)paVar7->action);
          *pvVar5 = 1.0 / local_e8 + *pvVar5;
        }
      }
      else {
        in_stack_ffffffffffffff00 = (v_array<ACTION_SCORE::action_score> *)&in_RDI[1].erase_count;
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)&this->scalars,0);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff00,
                            (ulong)paVar7->action);
        *pvVar5 = *pvVar5 + 1.0;
      }
    }
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_7c = 0;
    while( true ) {
      a_s = (action_scores *)(ulong)local_7c;
      paVar8 = (action_scores *)
               std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 1));
      if (paVar8 <= a_s) break;
      v_array<ACTION_SCORE::action_score>::push_back
                ((v_array<ACTION_SCORE::action_score> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      local_7c = local_7c + 1;
    }
    std::begin<std::vector<float,std::allocator<float>>>
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee8);
    std::end<std::vector<float,std::allocator<float>>>
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee8);
    ACTION_SCORE::begin_scores(a_s);
    ACTION_SCORE::end_scores(a_s);
    exploration::
    generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    ACTION_SCORE::begin_scores(a_s);
    ACTION_SCORE::end_scores(a_s);
    exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
              (in_stack_ffffffffffffff34,(bool)in_stack_ffffffffffffff33,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    do_sort(in_stack_00000160);
    for (i_00 = 0; i_00 < local_24; i_00 = i_00 + 1) {
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](in_RDI,i_00);
      paVar9 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)&this->scalars,i_00);
      *paVar9 = *paVar7;
    }
  }
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (CB::ec_is_example_header(*examples[0]))
    num_actions--;
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}